

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O3

int mpz_set_str(__mpz_struct *r,char *sp,int base)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  uchar *sp_00;
  mp_limb_t *rp;
  mp_size_t mVar8;
  ulong size;
  mp_ptr rp_00;
  ulong uVar9;
  size_t sn;
  byte *__s;
  byte bVar10;
  char *pcVar11;
  char *pcVar12;
  mpn_base_info info;
  mpn_base_info local_40;
  
  pcVar12 = sp + -1;
  do {
    pcVar11 = pcVar12;
    bVar1 = pcVar11[1];
    pcVar12 = pcVar11 + 1;
    iVar4 = isspace((uint)bVar1);
  } while (iVar4 != 0);
  uVar9 = (ulong)(bVar1 == 0x2d);
  __s = (byte *)(pcVar12 + uVar9);
  if (base == 0) {
    bVar10 = pcVar12[uVar9];
    base = 10;
    if (bVar10 != 0x30) goto LAB_005d3aa3;
    bVar10 = pcVar11[uVar9 + 2];
    if (bVar10 < 0x62) {
      if (bVar10 == 0x42) {
LAB_005d3c1c:
        __s = (byte *)(pcVar12 + uVar9 + 2);
        base = 2;
        goto LAB_005d3a9f;
      }
      if (bVar10 == 0x58) {
LAB_005d3c0a:
        __s = (byte *)(pcVar12 + uVar9 + 2);
        base = 0x10;
        goto LAB_005d3a9f;
      }
    }
    else {
      if (bVar10 == 0x62) goto LAB_005d3c1c;
      if (bVar10 == 0x78) goto LAB_005d3c0a;
    }
    base = 8;
LAB_005d3aab:
    sVar7 = strlen((char *)__s);
    sp_00 = (uchar *)(*gmp_allocate_func)(sVar7);
    iVar4 = 10;
    if (0x24 < base) {
      iVar4 = 0x24;
    }
    bVar10 = *__s;
    if (bVar10 != 0) {
      sn = 0;
      do {
        __s = __s + 1;
        iVar5 = isspace((uint)bVar10);
        if (iVar5 == 0) {
          if ((byte)(bVar10 - 0x30) < 10) {
            uVar6 = (uint)(byte)(bVar10 - 0x30);
LAB_005d3b30:
            if (uVar6 < (uint)base) {
              sp_00[sn] = (uchar)uVar6;
              sn = sn + 1;
              goto LAB_005d3b44;
            }
          }
          else {
            if ((byte)(bVar10 + 0x9f) < 0x1a) {
              uVar6 = (uint)(byte)(bVar10 + 0x9f) + iVar4;
              goto LAB_005d3b30;
            }
            if ((byte)(bVar10 + 0xbf) < 0x1a) {
              uVar6 = bVar10 - 0x37;
              goto LAB_005d3b30;
            }
          }
          (*gmp_free_func)(sp_00,sVar7);
          iVar5 = -1;
          iVar4 = 0;
          goto LAB_005d3cf2;
        }
LAB_005d3b44:
        bVar10 = *__s;
      } while (bVar10 != 0);
      if (sn != 0) {
        uVar6 = mpn_base_power_of_two_p(base);
        if (uVar6 == 0) {
          uVar9 = (ulong)base;
          local_40.exp = 1;
          local_40.bb = uVar9;
          if (-1 < base) {
            do {
              local_40.bb = local_40.bb * uVar9;
              local_40.exp = local_40.exp + 1;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = uVar9;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = local_40.bb;
            } while (SUB168(auVar2 * auVar3,8) == 0);
          }
          size = ((sn + local_40.exp) - 1) / (ulong)local_40.exp;
          if ((long)r->_mp_alloc < (long)size) {
            rp_00 = mpz_realloc(r,size);
          }
          else {
            rp_00 = r->_mp_d;
          }
          mVar8 = mpn_set_str_other(rp_00,sp_00,sn,uVar9,&local_40);
          iVar5 = (int)mVar8 - (uint)(rp_00[mVar8 + -1] == 0);
        }
        else {
          uVar9 = uVar6 * sn + 0x3f >> 6;
          if ((long)r->_mp_alloc < (long)uVar9) {
            rp = mpz_realloc(r,uVar9);
          }
          else {
            rp = r->_mp_d;
          }
          mVar8 = mpn_set_str_bits(rp,sp_00,sn,uVar6);
          iVar5 = (int)mVar8;
        }
        (*gmp_free_func)(sp_00,sVar7);
        iVar4 = -iVar5;
        if (bVar1 != 0x2d) {
          iVar4 = iVar5;
        }
        iVar5 = 0;
        goto LAB_005d3cf2;
      }
    }
    (*gmp_free_func)(sp_00,sVar7);
  }
  else {
LAB_005d3a9f:
    bVar10 = *__s;
LAB_005d3aa3:
    if (bVar10 != 0) goto LAB_005d3aab;
  }
  iVar5 = -1;
  iVar4 = 0;
LAB_005d3cf2:
  r->_mp_size = iVar4;
  return iVar5;
}

Assistant:

int
mpz_set_str (mpz_t r, const char *sp, int base)
{
  unsigned bits, value_of_a;
  mp_size_t rn, alloc;
  mp_ptr rp;
  size_t dn, sn;
  int sign;
  unsigned char *dp;

  assert (base == 0 || (base >= 2 && base <= 62));

  while (isspace( (unsigned char) *sp))
    sp++;

  sign = (*sp == '-');
  sp += sign;

  if (base == 0)
    {
      if (sp[0] == '0')
	{
	  if (sp[1] == 'x' || sp[1] == 'X')
	    {
	      base = 16;
	      sp += 2;
	    }
	  else if (sp[1] == 'b' || sp[1] == 'B')
	    {
	      base = 2;
	      sp += 2;
	    }
	  else
	    base = 8;
	}
      else
	base = 10;
    }

  if (!*sp)
    {
      r->_mp_size = 0;
      return -1;
    }
  sn = strlen(sp);
  dp = (unsigned char *) gmp_alloc (sn);

  value_of_a = (base > 36) ? 36 : 10;
  for (dn = 0; *sp; sp++)
    {
      unsigned digit;

      if (isspace ((unsigned char) *sp))
	continue;
      else if (*sp >= '0' && *sp <= '9')
	digit = *sp - '0';
      else if (*sp >= 'a' && *sp <= 'z')
	digit = *sp - 'a' + value_of_a;
      else if (*sp >= 'A' && *sp <= 'Z')
	digit = *sp - 'A' + 10;
      else
	digit = base; /* fail */

      if (digit >= (unsigned) base)
	{
	  gmp_free (dp, sn);
	  r->_mp_size = 0;
	  return -1;
	}

      dp[dn++] = digit;
    }

  if (!dn)
    {
      gmp_free (dp, sn);
      r->_mp_size = 0;
      return -1;
    }
  bits = mpn_base_power_of_two_p (base);

  if (bits > 0)
    {
      alloc = (dn * bits + GMP_LIMB_BITS - 1) / GMP_LIMB_BITS;
      rp = MPZ_REALLOC (r, alloc);
      rn = mpn_set_str_bits (rp, dp, dn, bits);
    }
  else
    {
      struct mpn_base_info info;
      mpn_get_base_info (&info, base);
      alloc = (dn + info.exp - 1) / info.exp;
      rp = MPZ_REALLOC (r, alloc);
      rn = mpn_set_str_other (rp, dp, dn, base, &info);
      /* Normalization, needed for all-zero input. */
      assert (rn > 0);
      rn -= rp[rn-1] == 0;
    }
  assert (rn <= alloc);
  gmp_free (dp, sn);

  r->_mp_size = sign ? - rn : rn;

  return 0;
}